

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O1

void __thiscall
siamese::RecoveryMatrixState::PopulateColumns
          (RecoveryMatrixState *this,uint oldColumns,uint newColumns)

{
  OriginalPacket *pOVar1;
  uint uVar2;
  DecoderPacketWindow *pDVar3;
  DecoderSubwindow *pDVar4;
  ColumnInfo *pCVar5;
  ulong uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (oldColumns < newColumns) {
    pktalloc::LightVector<siamese::RecoveryMatrixState::ColumnInfo,_25U>::SetSize_Copy
              (&this->Columns,newColumns);
    uVar8 = this->PreviousNextCheckStart;
    pDVar3 = this->Window;
    uVar2 = this->CheckedRegion->NextCheckStart;
    this->PreviousNextCheckStart = uVar2;
    uVar10 = this->CheckedRegion->ElementStart;
    if (uVar10 < uVar8) {
      uVar10 = uVar8;
    }
    uVar8 = uVar10 >> 6;
    uVar11 = (ulong)(uVar10 & 0x3f);
    do {
      if (uVar2 + 0x3f >> 6 <= uVar8) {
        this->Window->EmergencyDisabled = true;
        return;
      }
      pDVar4 = (pDVar3->Subwindows).DataPtr[(int)uVar8];
      if (pDVar4->GotCount < 0x40) {
        pCVar5 = (this->Columns).DataPtr;
        do {
          uVar13 = ~(&pDVar4->Got)[uVar11 >> 6].Words[0] >> (uVar11 & 0x3f);
          if (uVar13 == 0) {
            uVar11 = 0x40;
          }
          else {
            iVar9 = 0;
            for (uVar6 = uVar13; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
              iVar9 = iVar9 + 1;
            }
            if ((uVar13 & 1) != 0) {
              iVar9 = 0;
            }
            uVar11 = (ulong)(uint)(iVar9 + (int)uVar11);
          }
          uVar10 = (uint)uVar11;
          if (0x3f < uVar10) break;
          uVar12 = (uVar10 | uVar8 << 6) + pDVar3->ColumnStart & 0x3fffff;
          pOVar1 = (pDVar4->Originals)._M_elems + uVar11;
          pCVar5[(int)oldColumns].Column = uVar12;
          pCVar5[(int)oldColumns].Original = pOVar1;
          uVar12 = uVar12 * 199;
          pCVar5[(int)oldColumns].CX = (char)uVar12 + (char)(uVar12 / 0xfd) * '\x03' + '\x03';
          pOVar1->Column = oldColumns;
          oldColumns = oldColumns + 1;
          if (newColumns <= oldColumns) {
            bVar7 = false;
            goto LAB_0016b6f8;
          }
          uVar11 = (ulong)(uVar10 + 1);
        } while (uVar10 != 0x3f);
      }
      uVar8 = uVar8 + 1;
      bVar7 = true;
      uVar11 = 0;
LAB_0016b6f8:
    } while (bVar7);
  }
  return;
}

Assistant:

void RecoveryMatrixState::PopulateColumns(const unsigned oldColumns, const unsigned newColumns)
{
    if (oldColumns >= newColumns)
        return;

    Columns.SetSize_Copy(newColumns);

    // Resume adding from the last stop point
    unsigned elementStart     = PreviousNextCheckStart;
    PreviousNextCheckStart    = CheckedRegion->NextCheckStart;
    const unsigned elementEnd = CheckedRegion->NextCheckStart;
    if (elementStart < CheckedRegion->ElementStart)
        elementStart = CheckedRegion->ElementStart;

    // The column count increased which means we should have some columns to check
    SIAMESE_DEBUG_ASSERT(elementStart < elementEnd);

    // Check the current subwindow for next lost packet:
    const unsigned subwindowEnd = (elementEnd + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex     = elementStart / kSubwindowSize;

    unsigned bitIndex = elementStart % kSubwindowSize;
    unsigned column   = oldColumns;

    while (subwindowIndex < subwindowEnd)
    {
        SIAMESE_DEBUG_ASSERT(subwindowIndex < Window->Subwindows.GetSize());

        DecoderSubwindow* subwindowPtr = Window->Subwindows.GetRef(subwindowIndex);

        // If there may be any lost packets in this subwindow:
        if (subwindowPtr->GotCount < kSubwindowSize)
        {
            do
            {
                // Seek next clear bit
                bitIndex = subwindowPtr->Got.FindFirstClear(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize)
                    break;

                // Calculate element index and stop if we hit the end of the valid data
                const unsigned element = subwindowIndex * kSubwindowSize + bitIndex;
                SIAMESE_DEBUG_ASSERT(element < elementEnd);

                ColumnInfo* columnPtr = Columns.GetPtr(column);
                columnPtr->Column     = Window->ElementToColumn(element);
                columnPtr->Original   = &subwindowPtr->Originals[bitIndex];
                columnPtr->CX         = GetColumnValue(columnPtr->Column);

                // Point lost original packet to recovery matrix column
                SIAMESE_DEBUG_ASSERT(columnPtr->Original->Buffer.Bytes == 0);
                columnPtr->Original->Column = column;

                // If we just added the last column:
                if (++column >= newColumns)
                    return;

            } while (++bitIndex < kSubwindowSize);
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    SIAMESE_DEBUG_BREAK(); // Should never get here
    Window->EmergencyDisabled = true;
}